

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O3

void __thiscall xercesc_4_0::AllContentModel::~AllContentModel(AllContentModel *this)

{
  ulong uVar1;
  ulong uVar2;
  
  (this->super_XMLContentModel)._vptr_XMLContentModel = (_func_int **)&PTR__AllContentModel_0040bce8
  ;
  uVar1 = this->fCount;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (this->fChildren[uVar2] != (QName *)0x0) {
        (*(this->fChildren[uVar2]->super_XSerializable)._vptr_XSerializable[1])();
        uVar1 = this->fCount;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fChildren);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fChildOptional);
  return;
}

Assistant:

AllContentModel::~AllContentModel()
{
    for (XMLSize_t index = 0; index < fCount; index++)
        delete fChildren[index];
    fMemoryManager->deallocate(fChildren); //delete [] fChildren;
    fMemoryManager->deallocate(fChildOptional); //delete [] fChildOptional;
}